

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

int type_dup(lys_module *mod,lys_node *parent,lys_type *new,lys_type *old,LY_DATA_TYPE base,
            int in_grp,unres_schema *unres)

{
  lys_type_bit *plVar1;
  int iVar2;
  int iVar3;
  lys_restr *plVar4;
  char *pcVar5;
  lys_type_bit *plVar6;
  LY_ERR *pLVar7;
  long lVar8;
  long lVar9;
  
  switch(base) {
  case LY_TYPE_BITS:
    iVar2 = (old->info).bits.count;
    (new->info).bits.count = iVar2;
    if ((long)iVar2 == 0) {
      return 0;
    }
    plVar6 = (lys_type_bit *)calloc((long)iVar2,0x30);
    (new->info).bits.bit = plVar6;
    if (plVar6 != (lys_type_bit *)0x0) {
      if ((new->info).bits.count < 1) {
        return 0;
      }
      lVar9 = 0x20;
      lVar8 = 0;
      do {
        pcVar5 = lydict_insert(mod->ctx,*(char **)((long)(old->info).bits.bit + lVar9 + -0x20),0);
        *(char **)((long)(new->info).bits.bit + lVar9 + -0x20) = pcVar5;
        pcVar5 = lydict_insert(mod->ctx,*(char **)((long)(old->info).bits.bit + lVar9 + -0x18),0);
        *(char **)((long)(new->info).bits.bit + lVar9 + -0x18) = pcVar5;
        pcVar5 = lydict_insert(mod->ctx,*(char **)((long)(old->info).bits.bit + lVar9 + -0x10),0);
        *(char **)((long)(new->info).bits.bit + lVar9 + -0x10) = pcVar5;
        *(undefined2 *)((long)(new->info).bits.bit + lVar9 + -8) =
             *(undefined2 *)((long)(old->info).bits.bit + lVar9 + -8);
        *(undefined4 *)((long)(new->info).bits.bit + lVar9 + -4) =
             *(undefined4 *)((long)(old->info).bits.bit + lVar9 + -4);
        *(undefined1 *)((long)(new->info).bits.bit + lVar9 + -6) =
             *(undefined1 *)((long)(old->info).bits.bit + lVar9 + -6);
        plVar6 = (old->info).bits.bit;
        plVar1 = (new->info).bits.bit;
        iVar2 = lys_ext_dup(mod,*(lys_ext_instance ***)((long)&plVar6->name + lVar9),
                            *(uint8_t *)((long)plVar6 + lVar9 + -6),
                            (void *)((long)plVar1 + lVar9 + -0x20),LYEXT_PAR_TYPE_BIT,
                            (lys_ext_instance ***)((long)&plVar1->name + lVar9),unres);
        if (iVar2 != 0) {
          return -1;
        }
        lVar8 = lVar8 + 1;
        lVar9 = lVar9 + 0x30;
      } while (lVar8 < (new->info).bits.count);
      return 0;
    }
    break;
  default:
    return 0;
  case LY_TYPE_DEC64:
    (new->info).dec64.dig = (old->info).dec64.dig;
    (new->info).dec64.div = (old->info).dec64.div;
  case LY_TYPE_BINARY:
  case LY_TYPE_INT8:
  case LY_TYPE_UINT8:
  case LY_TYPE_INT16:
  case LY_TYPE_UINT16:
  case LY_TYPE_INT32:
  case LY_TYPE_UINT32:
  case LY_TYPE_INT64:
  case LY_TYPE_UINT64:
    plVar4 = (old->info).dec64.range;
    if (plVar4 != (lys_restr *)0x0) {
      plVar4 = lys_restr_dup(mod,plVar4,1,unres);
      (new->info).dec64.range = plVar4;
      return 0;
    }
    return 0;
  case LY_TYPE_ENUM:
    iVar2 = (old->info).bits.count;
    (new->info).bits.count = iVar2;
    if ((long)iVar2 == 0) {
      return 0;
    }
    plVar6 = (lys_type_bit *)calloc((long)iVar2,0x30);
    (new->info).bits.bit = plVar6;
    if (plVar6 != (lys_type_bit *)0x0) {
      if ((new->info).bits.count < 1) {
        return 0;
      }
      lVar9 = 0x20;
      lVar8 = 0;
      do {
        pcVar5 = lydict_insert(mod->ctx,*(char **)((long)(old->info).bits.bit + lVar9 + -0x20),0);
        *(char **)((long)(new->info).bits.bit + lVar9 + -0x20) = pcVar5;
        pcVar5 = lydict_insert(mod->ctx,*(char **)((long)(old->info).bits.bit + lVar9 + -0x18),0);
        *(char **)((long)(new->info).bits.bit + lVar9 + -0x18) = pcVar5;
        pcVar5 = lydict_insert(mod->ctx,*(char **)((long)(old->info).bits.bit + lVar9 + -0x10),0);
        *(char **)((long)(new->info).bits.bit + lVar9 + -0x10) = pcVar5;
        *(undefined2 *)((long)(new->info).bits.bit + lVar9 + -8) =
             *(undefined2 *)((long)(old->info).bits.bit + lVar9 + -8);
        *(undefined4 *)((long)(new->info).bits.bit + lVar9 + -4) =
             *(undefined4 *)((long)(old->info).bits.bit + lVar9 + -4);
        *(undefined1 *)((long)(new->info).bits.bit + lVar9 + -6) =
             *(undefined1 *)((long)(old->info).bits.bit + lVar9 + -6);
        plVar6 = (old->info).bits.bit;
        plVar1 = (new->info).bits.bit;
        iVar2 = lys_ext_dup(mod,*(lys_ext_instance ***)((long)&plVar6->name + lVar9),
                            *(uint8_t *)((long)plVar6 + lVar9 + -6),
                            (void *)((long)plVar1 + lVar9 + -0x20),LYEXT_PAR_TYPE_ENUM,
                            (lys_ext_instance ***)((long)&plVar1->name + lVar9),unres);
        if (iVar2 != 0) {
          return -1;
        }
        lVar8 = lVar8 + 1;
        lVar9 = lVar9 + 0x30;
      } while (lVar8 < (new->info).bits.count);
      return 0;
    }
    break;
  case LY_TYPE_IDENT:
    (new->info).bits.count = (old->info).bits.count;
    lVar8 = (long)(old->info).bits.count;
    if (lVar8 == 0) {
      iVar2 = -1;
      while ((iVar3 = unres_schema_find(unres,iVar2,old,UNRES_TYPE_IDENTREF), iVar3 == -1 ||
             (iVar2 = unres_schema_add_str
                                (mod,unres,new,UNRES_TYPE_IDENTREF,(char *)unres->str_snode[iVar3]),
             iVar2 != -1))) {
        iVar2 = iVar3 + -1;
        if (iVar3 < 1) {
          return 0;
        }
      }
      return -1;
    }
    plVar6 = (lys_type_bit *)malloc(lVar8 << 3);
    (new->info).bits.bit = plVar6;
    if (plVar6 != (lys_type_bit *)0x0) {
      memcpy(plVar6,(old->info).bits.bit,(long)(old->info).bits.count << 3);
      return 0;
    }
    break;
  case LY_TYPE_INST:
    (new->info).inst.req = (old->info).inst.req;
    return 0;
  case LY_TYPE_LEAFREF:
    pcVar5 = (old->info).lref.path;
    if (pcVar5 == (char *)0x0) {
      return 0;
    }
    pcVar5 = lydict_insert(mod->ctx,pcVar5,0);
    (new->info).lref.path = pcVar5;
    if (in_grp != 0) {
      return 0;
    }
    iVar2 = unres_schema_add_node(mod,unres,new,UNRES_TYPE_LEAFREF,parent);
    if (iVar2 != -1) {
      return 0;
    }
    return -1;
  case LY_TYPE_STRING:
    plVar4 = (old->info).dec64.range;
    if (plVar4 != (lys_restr *)0x0) {
      plVar4 = lys_restr_dup(mod,plVar4,1,unres);
      (new->info).dec64.range = plVar4;
    }
    plVar4 = lys_restr_dup(mod,(old->info).str.patterns,(old->info).str.pat_count,unres);
    (new->info).str.patterns = plVar4;
    (new->info).str.pat_count = (old->info).str.pat_count;
    return 0;
  case LY_TYPE_UNION:
    iVar2 = (old->info).bits.count;
    (new->info).bits.count = iVar2;
    if ((long)iVar2 == 0) {
      return 0;
    }
    plVar6 = (lys_type_bit *)calloc((long)iVar2,0x40);
    (new->info).bits.bit = plVar6;
    if (plVar6 != (lys_type_bit *)0x0) {
      if ((new->info).bits.count < 1) {
        return 0;
      }
      lVar9 = 0;
      lVar8 = 0;
      do {
        iVar2 = lys_type_dup(mod,parent,(lys_type *)((long)&((new->info).bits.bit)->name + lVar9),
                             (lys_type *)((long)&((old->info).bits.bit)->name + lVar9),in_grp,unres)
        ;
        if (iVar2 != 0) {
          return -1;
        }
        lVar8 = lVar8 + 1;
        lVar9 = lVar9 + 0x40;
      } while (lVar8 < (new->info).bits.count);
      return 0;
    }
  }
  pLVar7 = ly_errno_location();
  *pLVar7 = LY_EMEM;
  ly_log(LY_LLERR,"Memory allocation failed (%s()).","type_dup");
  return -1;
}

Assistant:

static int
type_dup(struct lys_module *mod, struct lys_node *parent, struct lys_type *new, struct lys_type *old,
              LY_DATA_TYPE base, int in_grp, struct unres_schema *unres)
{
    int i;

    switch (base) {
        case LY_TYPE_BINARY:
            if (old->info.binary.length) {
                new->info.binary.length = lys_restr_dup(mod, old->info.binary.length, 1, unres);
            }
            break;

        case LY_TYPE_BITS:
            new->info.bits.count = old->info.bits.count;
            if (new->info.bits.count) {
                new->info.bits.bit = calloc(new->info.bits.count, sizeof *new->info.bits.bit);
                if (!new->info.bits.bit) {
                    LOGMEM;
                    return -1;
                }
                for (i = 0; i < new->info.bits.count; i++) {
                    new->info.bits.bit[i].name = lydict_insert(mod->ctx, old->info.bits.bit[i].name, 0);
                    new->info.bits.bit[i].dsc = lydict_insert(mod->ctx, old->info.bits.bit[i].dsc, 0);
                    new->info.bits.bit[i].ref = lydict_insert(mod->ctx, old->info.bits.bit[i].ref, 0);
                    new->info.bits.bit[i].flags = old->info.bits.bit[i].flags;
                    new->info.bits.bit[i].pos = old->info.bits.bit[i].pos;
                    new->info.bits.bit[i].ext_size = old->info.bits.bit[i].ext_size;
                    if (lys_ext_dup(mod, old->info.bits.bit[i].ext, old->info.bits.bit[i].ext_size,
                                    &new->info.bits.bit[i], LYEXT_PAR_TYPE_BIT,
                                    &new->info.bits.bit[i].ext, unres)) {
                        return -1;
                    }
                }
            }
            break;

        case LY_TYPE_DEC64:
            new->info.dec64.dig = old->info.dec64.dig;
            new->info.dec64.div = old->info.dec64.div;
            if (old->info.dec64.range) {
                new->info.dec64.range = lys_restr_dup(mod, old->info.dec64.range, 1, unres);
            }
            break;

        case LY_TYPE_ENUM:
            new->info.enums.count = old->info.enums.count;
            if (new->info.enums.count) {
                new->info.enums.enm = calloc(new->info.enums.count, sizeof *new->info.enums.enm);
                if (!new->info.enums.enm) {
                    LOGMEM;
                    return -1;
                }
                for (i = 0; i < new->info.enums.count; i++) {
                    new->info.enums.enm[i].name = lydict_insert(mod->ctx, old->info.enums.enm[i].name, 0);
                    new->info.enums.enm[i].dsc = lydict_insert(mod->ctx, old->info.enums.enm[i].dsc, 0);
                    new->info.enums.enm[i].ref = lydict_insert(mod->ctx, old->info.enums.enm[i].ref, 0);
                    new->info.enums.enm[i].flags = old->info.enums.enm[i].flags;
                    new->info.enums.enm[i].value = old->info.enums.enm[i].value;
                    new->info.enums.enm[i].ext_size = old->info.enums.enm[i].ext_size;
                    if (lys_ext_dup(mod, old->info.enums.enm[i].ext, old->info.enums.enm[i].ext_size,
                                    &new->info.enums.enm[i], LYEXT_PAR_TYPE_ENUM,
                                    &new->info.enums.enm[i].ext, unres)) {
                        return -1;
                    }
                }
            }
            break;

        case LY_TYPE_IDENT:
            new->info.ident.count = old->info.ident.count;
            if (old->info.ident.count) {
                new->info.ident.ref = malloc(old->info.ident.count * sizeof *new->info.ident.ref);
                if (!new->info.ident.ref) {
                    LOGMEM;
                    return -1;
                }
                memcpy(new->info.ident.ref, old->info.ident.ref, old->info.ident.count * sizeof *new->info.ident.ref);
            } else {
                /* there can be several unresolved base identities, duplicate them all */
                i = -1;
                do {
                    i = unres_schema_find(unres, i, old, UNRES_TYPE_IDENTREF);
                    if (i != -1) {
                        if (unres_schema_add_str(mod, unres, new, UNRES_TYPE_IDENTREF, unres->str_snode[i]) == -1) {
                            return -1;
                        }
                    }
                    --i;
                } while (i > -1);
            }
            break;

        case LY_TYPE_INST:
            new->info.inst.req = old->info.inst.req;
            break;

        case LY_TYPE_INT8:
        case LY_TYPE_INT16:
        case LY_TYPE_INT32:
        case LY_TYPE_INT64:
        case LY_TYPE_UINT8:
        case LY_TYPE_UINT16:
        case LY_TYPE_UINT32:
        case LY_TYPE_UINT64:
            if (old->info.num.range) {
                new->info.num.range = lys_restr_dup(mod, old->info.num.range, 1, unres);
            }
            break;

        case LY_TYPE_LEAFREF:
            if (old->info.lref.path) {
                new->info.lref.path = lydict_insert(mod->ctx, old->info.lref.path, 0);
                if (!in_grp && unres_schema_add_node(mod, unres, new, UNRES_TYPE_LEAFREF, parent) == -1) {
                    return -1;
                }
            }
            break;

        case LY_TYPE_STRING:
            if (old->info.str.length) {
                new->info.str.length = lys_restr_dup(mod, old->info.str.length, 1, unres);
            }
            new->info.str.patterns = lys_restr_dup(mod, old->info.str.patterns, old->info.str.pat_count, unres);
            new->info.str.pat_count = old->info.str.pat_count;
            break;

        case LY_TYPE_UNION:
            new->info.uni.count = old->info.uni.count;
            if (new->info.uni.count) {
                new->info.uni.types = calloc(new->info.uni.count, sizeof *new->info.uni.types);
                if (!new->info.uni.types) {
                    LOGMEM;
                    return -1;
                }
                for (i = 0; i < new->info.uni.count; i++) {
                    if (lys_type_dup(mod, parent, &(new->info.uni.types[i]), &(old->info.uni.types[i]), in_grp, unres)) {
                        return -1;
                    }
                }
            }
            break;

        default:
            /* nothing to do for LY_TYPE_BOOL, LY_TYPE_EMPTY */
            break;
    }
    return EXIT_SUCCESS;
}